

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeFabricEdgeGetVerticesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_vertex_handle_t *phVertexA,
          ze_fabric_vertex_handle_t *phVertexB)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  long lVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar5 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zeFabricEdgeGetVerticesExp(hEdge, phVertexA, phVertexB)",&local_59
            );
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar5 + 0x650) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar5 + 0xd38) - *(long *)(lVar5 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar5 + 0x650);
    do {
      if (lVar3 == lVar4) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeFabricEdgeGetVerticesExpPrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),hEdge,phVertexA,
                                phVertexB), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hEdge,phVertexA,phVertexB);
          lVar5 = 0;
          goto LAB_00157baa;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar4 * 8);
      result = (**(code **)(*plVar1 + 0xb50))(plVar1,hEdge,phVertexA,phVertexB);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00157be2;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar5 * 8);
    result = (**(code **)(*plVar1 + 0xb58))(plVar1,hEdge,phVertexA,phVertexB,zVar2);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00157baa:
    lVar4 = context;
    if (lVar3 == lVar5) {
      result = zVar2;
      if ((zVar2 == ZE_RESULT_SUCCESS) && (*(char *)(context + 4) == '\x01')) {
        if (phVertexA != (ze_fabric_vertex_handle_t *)0x0) {
          HandleLifetimeValidation::addHandle
                    (*(HandleLifetimeValidation **)(context + 0xd48),*phVertexA);
          HandleLifetimeValidation::addDependent
                    (*(HandleLifetimeValidation **)(lVar4 + 0xd48),hEdge,*phVertexA);
        }
        if (phVertexB != (ze_fabric_vertex_handle_t *)0x0) {
          HandleLifetimeValidation::addHandle
                    (*(HandleLifetimeValidation **)(lVar4 + 0xd48),*phVertexB);
          HandleLifetimeValidation::addDependent
                    (*(HandleLifetimeValidation **)(lVar4 + 0xd48),hEdge,*phVertexB);
        }
      }
      break;
    }
  }
LAB_00157be2:
  logAndPropagateResult("zeFabricEdgeGetVerticesExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetVerticesExp(
        ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge instance
        ze_fabric_vertex_handle_t* phVertexA,           ///< [out] fabric vertex connected to one end of the given fabric edge.
        ze_fabric_vertex_handle_t* phVertexB            ///< [out] fabric vertex connected to other end of the given fabric edge.
        )
    {
        context.logger->log_trace("zeFabricEdgeGetVerticesExp(hEdge, phVertexA, phVertexB)");

        auto pfnGetVerticesExp = context.zeDdiTable.FabricEdgeExp.pfnGetVerticesExp;

        if( nullptr == pfnGetVerticesExp )
            return logAndPropagateResult("zeFabricEdgeGetVerticesExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeFabricEdgeGetVerticesExpPrologue( hEdge, phVertexA, phVertexB );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeFabricEdgeGetVerticesExpPrologue( hEdge, phVertexA, phVertexB );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }

        auto driver_result = pfnGetVerticesExp( hEdge, phVertexA, phVertexB );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeFabricEdgeGetVerticesExpEpilogue( hEdge, phVertexA, phVertexB ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeFabricEdgeGetVerticesExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phVertexA){
                context.handleLifetime->addHandle( *phVertexA );
                context.handleLifetime->addDependent( hEdge, *phVertexA );

            }
            if (phVertexB){
                context.handleLifetime->addHandle( *phVertexB );
                context.handleLifetime->addDependent( hEdge, *phVertexB );

            }
        }
        return logAndPropagateResult("zeFabricEdgeGetVerticesExp", driver_result);
    }